

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_symbol(nk_command_buffer *out,nk_symbol_type type,nk_rect content,nk_color background,
                   nk_color foreground,float border_width,nk_user_font *font)

{
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_rect b;
  nk_rect r_03;
  ulong uVar1;
  uint in_ESI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  nk_vec2 points [3];
  nk_heading heading;
  nk_text text;
  char *X;
  undefined8 in_stack_fffffffffffffea0;
  nk_command_buffer *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  nk_color nVar2;
  float rounding;
  nk_command_buffer *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  nk_color in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  nk_user_font *in_stack_fffffffffffffef8;
  nk_heading in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff34;
  
  r_03.y = (float)in_XMM0_Db;
  r_03.x = (float)in_XMM0_Da;
  uVar1 = CONCAT44(0.0,in_ESI);
  switch(uVar1) {
  default:
    break;
  case 1:
  case 2:
  case 0xb:
  case 0xc:
    nk_vec2(0.0,0.0);
    b.y = (float)(int)in_stack_ffffffffffffff2c;
    b.w = (float)(int)((ulong)in_stack_ffffffffffffff2c >> 0x20);
    b.x = (float)in_stack_ffffffffffffff28;
    b.h = in_stack_ffffffffffffff34;
    nk_widget_text((nk_command_buffer *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),b,
                   in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                   (nk_text *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    nVar2 = SUB84((ulong)in_stack_fffffffffffffeb0 >> 0x20,0);
    if ((in_ESI == 5) || (in_ESI == 6)) {
      rect.w = (float)in_stack_fffffffffffffed0;
      rect.x = (float)in_ESI;
      rect.y = 0.0;
      rect.h = in_stack_fffffffffffffed4;
      nk_fill_rect(in_stack_fffffffffffffeb8,rect,(float)nVar2,in_stack_fffffffffffffec4);
      rounding = (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
      if (in_ESI == 6) {
        r_03._8_8_ = in_XMM1_Qa;
        nk_shrink_rect(r_03,in_XMM2_Da);
        rect_00.w = (float)in_stack_fffffffffffffed0;
        rect_00.x = (float)(int)uVar1;
        rect_00.y = (float)(int)(uVar1 >> 0x20);
        rect_00.h = in_stack_fffffffffffffed4;
        nk_fill_rect(in_stack_fffffffffffffeb8,rect_00,rounding,in_stack_fffffffffffffec4);
      }
    }
    else {
      r.w = (float)in_stack_fffffffffffffec0;
      r._0_8_ = in_stack_fffffffffffffeb8;
      r.h = (float)in_stack_fffffffffffffec4;
      nk_fill_circle(in_stack_fffffffffffffea8,r,nVar2);
      nVar2 = SUB84((ulong)in_stack_fffffffffffffeb0 >> 0x20,0);
      if (in_ESI == 4) {
        r_01.y = (float)in_XMM0_Db;
        r_01.x = (float)in_XMM0_Da;
        r_01.w = (float)(int)in_XMM1_Qa;
        r_01.h = (float)((ulong)in_XMM1_Qa >> 0x20);
        nk_shrink_rect(r_01,1.0);
        r_00.w = (float)in_stack_fffffffffffffec0;
        r_00._0_8_ = in_stack_fffffffffffffeb8;
        r_00.h = (float)in_stack_fffffffffffffec4;
        nk_fill_circle(in_stack_fffffffffffffea8,r_00,nVar2);
      }
    }
    break;
  case 7:
  case 8:
  case 9:
  case 10:
    r_02.w = (float)in_stack_ffffffffffffff20;
    r_02._0_8_ = in_stack_ffffffffffffff18;
    r_02.h = in_stack_ffffffffffffff24;
    nk_triangle_from_direction
              ((nk_vec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),r_02,
               in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    nk_fill_triangle(in_stack_fffffffffffffeb8,(float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                     (float)in_stack_fffffffffffffeb0,
                     (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                     SUB84(in_stack_fffffffffffffea8,0),
                     (float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     (float)in_stack_fffffffffffffea0,in_stack_fffffffffffffec4);
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_symbol(struct nk_command_buffer *out, enum nk_symbol_type type,
    struct nk_rect content, struct nk_color background, struct nk_color foreground,
    float border_width, const struct nk_user_font *font)
{
    switch (type) {
    case NK_SYMBOL_X:
    case NK_SYMBOL_UNDERSCORE:
    case NK_SYMBOL_PLUS:
    case NK_SYMBOL_MINUS: {
        /* single character text symbol */
        const char *X = (type == NK_SYMBOL_X) ? "x":
            (type == NK_SYMBOL_UNDERSCORE) ? "_":
            (type == NK_SYMBOL_PLUS) ? "+": "-";
        struct nk_text text;
        text.padding = nk_vec2(0,0);
        text.background = background;
        text.text = foreground;
        nk_widget_text(out, content, X, 1, &text, NK_TEXT_CENTERED, font);
    } break;
    case NK_SYMBOL_CIRCLE_SOLID:
    case NK_SYMBOL_CIRCLE_OUTLINE:
    case NK_SYMBOL_RECT_SOLID:
    case NK_SYMBOL_RECT_OUTLINE: {
        /* simple empty/filled shapes */
        if (type == NK_SYMBOL_RECT_SOLID || type == NK_SYMBOL_RECT_OUTLINE) {
            nk_fill_rect(out, content,  0, foreground);
            if (type == NK_SYMBOL_RECT_OUTLINE)
                nk_fill_rect(out, nk_shrink_rect(content, border_width), 0, background);
        } else {
            nk_fill_circle(out, content, foreground);
            if (type == NK_SYMBOL_CIRCLE_OUTLINE)
                nk_fill_circle(out, nk_shrink_rect(content, 1), background);
        }
    } break;
    case NK_SYMBOL_TRIANGLE_UP:
    case NK_SYMBOL_TRIANGLE_DOWN:
    case NK_SYMBOL_TRIANGLE_LEFT:
    case NK_SYMBOL_TRIANGLE_RIGHT: {
        enum nk_heading heading;
        struct nk_vec2 points[3];
        heading = (type == NK_SYMBOL_TRIANGLE_RIGHT) ? NK_RIGHT :
            (type == NK_SYMBOL_TRIANGLE_LEFT) ? NK_LEFT:
            (type == NK_SYMBOL_TRIANGLE_UP) ? NK_UP: NK_DOWN;
        nk_triangle_from_direction(points, content, 0, 0, heading);
        nk_fill_triangle(out, points[0].x, points[0].y, points[1].x, points[1].y,
            points[2].x, points[2].y, foreground);
    } break;
    default:
    case NK_SYMBOL_NONE:
    case NK_SYMBOL_MAX: break;
    }
}